

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

int __thiscall RenX::Server::sendMessage(Server *this,string_view message)

{
  list<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_> *plVar1;
  size_type sVar2;
  _Alloc_hider _Var3;
  int iVar4;
  rep rVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  int iVar8;
  _List_node_base *p_Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string_view str;
  string msg;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  TCPSocket *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  str._M_len = message._M_str;
  str._M_str = in_RCX;
  escapifyRCON_abi_cxx11_(&local_78,(RenX *)message._M_len,str);
  if (this->m_neverSay == true) {
    iVar8 = 0;
    if ((this->players).super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>.
        _M_impl._M_node._M_size != 0) {
      plVar1 = &this->players;
      p_Var9 = (plVar1->super__List_base<RenX::PlayerInfo,_std::allocator<RenX::PlayerInfo>_>).
               _M_impl._M_node.super__List_node_base._M_next;
      iVar8 = 0;
      if (p_Var9 != (_List_node_base *)plVar1) {
        local_58 = &this->m_sock;
        iVar8 = 0;
        do {
          if (*(char *)&p_Var9[0x11]._M_next == '\0') {
            string_printf_abi_cxx11_
                      (&local_b8,"chostprivatesay pid%d %.*s\n",
                       (ulong)*(uint *)((long)&p_Var9[0x10]._M_prev + 4),local_78._M_string_length,
                       local_78._M_dataplus._M_p);
            sVar2 = local_b8._M_string_length;
            _Var3._M_p = local_b8._M_dataplus._M_p;
            rVar5 = std::chrono::_V2::steady_clock::now();
            (this->m_lastSendActivity).__d.__r = rVar5;
            iVar4 = Jupiter::Socket::send(local_58,sVar2,_Var3._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            iVar8 = iVar8 + iVar4;
          }
          p_Var9 = p_Var9->_M_next;
        } while (p_Var9 != (_List_node_base *)plVar1);
      }
    }
  }
  else {
    local_50.field_2._M_allocated_capacity = 0x79617374736f6863;
    local_50.field_2._8_2_ = 0x20;
    local_50._M_string_length = 9;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_50,local_78._M_dataplus._M_p,local_78._M_string_length);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if (paVar10 == paVar7) {
      local_98.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_98.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
    }
    else {
      local_98.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_98._M_dataplus._M_p = (pointer)paVar10;
    }
    local_98._M_string_length = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_replace_aux(&local_98,local_98._M_string_length,0,1,'\n');
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar6->_M_dataplus)._M_p;
    paVar7 = &pbVar6->field_2;
    if (paVar10 == paVar7) {
      local_b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      paVar10 = &local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    sVar2 = pbVar6->_M_string_length;
    (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar6->_M_string_length = 0;
    (pbVar6->field_2)._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)paVar10;
    local_b8._M_string_length = sVar2;
    rVar5 = std::chrono::_V2::steady_clock::now();
    (this->m_lastSendActivity).__d.__r = rVar5;
    iVar8 = Jupiter::Socket::send(&this->m_sock,sVar2,paVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return iVar8;
}

Assistant:

int RenX::Server::sendMessage(std::string_view message) {
	std::string msg = RenX::escapifyRCON(message);
	if (m_neverSay) {
		int result = 0;
		if (this->players.size() != 0) {
			for (auto node = this->players.begin(); node != this->players.end(); ++node) {
				if (node->isBot == false) {
					result += sendSocket(string_printf("chostprivatesay pid%d %.*s\n", node->id, msg.size(),
						msg.data()));
				}
			}
		}
		return result;
	}

	return sendSocket("chostsay "s + msg + '\n');
}